

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  ImGuiWindow *window;
  ImVec2 IVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiID id;
  wchar_t wVar4;
  ImGuiOldColumns_conflict *pIVar5;
  ImGuiOldColumnData *pIVar6;
  ImGuiOldColumnData *pIVar7;
  wchar_t wVar8;
  long lVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  ImGuiContext_conflict *g;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pIVar3 = GImGui;
  window = (ImGuiWindow *)GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xef4,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window->DC).CurrentColumns != (ImGuiOldColumns_conflict *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xef5,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  id = GetColumnsID(str_id,columns_count);
  pIVar5 = (ImGuiOldColumns_conflict *)FindOrCreateColumns(window,id);
  if (pIVar5->ID != id) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xefa,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  pIVar5->Current = L'\0';
  pIVar5->Count = columns_count;
  pIVar5->Flags = flags;
  (window->DC).CurrentColumns = pIVar5;
  pIVar5->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar5->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar2 = (window->ClipRect).Max;
  (pIVar5->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar5->HostInitialClipRect).Max = IVar2;
  IVar2 = (window->ParentWorkRect).Max;
  (pIVar5->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar5->HostBackupParentWorkRect).Max = IVar2;
  IVar2 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar2;
  fVar1 = (pIVar3->Style).ItemSpacing.x;
  fVar15 = (window->WindowPadding).x;
  fVar17 = fVar1 - fVar15;
  fVar15 = fVar15 * 0.5;
  uVar14 = -(uint)(window->WindowBorderSize <= fVar15);
  fVar16 = (window->WorkRect).Max.x;
  fVar17 = (float)(-(uint)(0.0 <= fVar17) & (uint)fVar17);
  fVar18 = (fVar1 + fVar16) - fVar17;
  fVar16 = (float)(int)(float)(~uVar14 & (uint)window->WindowBorderSize | (uint)fVar15 & uVar14) +
           fVar16;
  if (fVar16 <= fVar18) {
    fVar18 = fVar16;
  }
  fVar17 = ((window->DC).Indent.x - fVar1) + fVar17;
  pIVar5->OffMinX = fVar17;
  fVar18 = fVar18 - (window->Pos).x;
  fVar17 = fVar17 + 1.0;
  uVar14 = -(uint)(fVar17 <= fVar18);
  pIVar5->OffMaxX = (float)(~uVar14 & (uint)fVar17 | (uint)fVar18 & uVar14);
  fVar15 = (window->DC).CursorPos.y;
  pIVar5->LineMaxY = fVar15;
  pIVar5->LineMinY = fVar15;
  wVar12 = (pIVar5->Columns).Size;
  wVar8 = columns_count + L'\x01';
  if (wVar12 == wVar8 || wVar12 == L'\0') {
    pIVar5->IsFirstFrame = wVar12 == L'\0';
    if (wVar12 != L'\0') goto LAB_001dc6b9;
    wVar12 = (pIVar5->Columns).Capacity;
  }
  else {
    wVar12 = (pIVar5->Columns).Capacity;
    if (wVar12 < L'\0') {
      wVar12 = L'\0';
      pIVar6 = (ImGuiOldColumnData *)MemAlloc(0);
      pIVar7 = (pIVar5->Columns).Data;
      if (pIVar7 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar6;
      (pIVar5->Columns).Capacity = L'\0';
    }
    (pIVar5->Columns).Size = L'\0';
    pIVar5->IsFirstFrame = true;
  }
  if (wVar12 <= columns_count) {
    pIVar6 = (ImGuiOldColumnData *)MemAlloc((ulong)(uint)wVar8 * 0x1c);
    pIVar7 = (pIVar5->Columns).Data;
    if (pIVar7 != (ImGuiOldColumnData *)0x0) {
      memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
      MemFree((pIVar5->Columns).Data);
    }
    (pIVar5->Columns).Data = pIVar6;
    (pIVar5->Columns).Capacity = wVar8;
  }
  wVar12 = (pIVar5->Columns).Size;
  wVar10 = L'\0';
  do {
    if (wVar12 == (pIVar5->Columns).Capacity) {
      if (wVar12 == L'\0') {
        wVar4 = L'\b';
      }
      else {
        wVar4 = wVar12 / 2 + wVar12;
      }
      wVar11 = wVar12 + L'\x01';
      if (wVar12 + L'\x01' < wVar4) {
        wVar11 = wVar4;
      }
      pIVar7 = (ImGuiOldColumnData *)MemAlloc((long)wVar11 * 0x1c);
      pIVar6 = (pIVar5->Columns).Data;
      if (pIVar6 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar7,pIVar6,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar7;
      (pIVar5->Columns).Capacity = wVar11;
      wVar12 = (pIVar5->Columns).Size;
    }
    else {
      pIVar7 = (pIVar5->Columns).Data;
    }
    pIVar7[wVar12].OffsetNorm = (float)wVar10 / (float)columns_count;
    pIVar6 = pIVar7 + wVar12;
    pIVar6->OffsetNormBeforeResize = 0.0;
    pIVar6->Flags = 0;
    (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).x = 0.0;
    (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).y = 0.0;
    pIVar7[wVar12].ClipRect.Max.x = 0.0;
    pIVar7[wVar12].ClipRect.Max.y = 0.0;
    wVar12 = (pIVar5->Columns).Size + L'\x01';
    (pIVar5->Columns).Size = wVar12;
    wVar10 = wVar10 + L'\x01';
  } while (wVar8 != wVar10);
LAB_001dc6b9:
  lVar9 = 0xc;
  uVar13 = 0;
  do {
    if ((long)(pIVar5->Columns).Size <= (long)uVar13) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x706,
                    "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
    }
    pIVar7 = (pIVar5->Columns).Data;
    fVar15 = (window->Pos).x;
    fVar18 = GetColumnOffset((int)uVar13);
    fVar16 = (window->Pos).x;
    uVar13 = uVar13 + 1;
    fVar17 = GetColumnOffset((int)uVar13);
    *(float *)((long)&pIVar7->OffsetNorm + lVar9) = (float)(int)(fVar18 + fVar15 + 0.5);
    *(undefined4 *)((long)&pIVar7->OffsetNormBeforeResize + lVar9) = 0xff7fffff;
    *(float *)((long)&pIVar7->Flags + lVar9) = (float)(int)(fVar17 + fVar16 + -1.0 + 0.5);
    *(undefined4 *)((long)&(pIVar7->ClipRect).Min.x + lVar9) = 0x7f7fffff;
    ImRect::ClipWithFull((ImRect *)((long)&pIVar7->OffsetNorm + lVar9),&window->ClipRect);
    lVar9 = lVar9 + 0x1c;
  } while ((uint)columns_count != uVar13);
  if (L'\x01' < pIVar5->Count) {
    ImDrawListSplitter::Split
              ((ImDrawListSplitter *)&pIVar5->Splitter,window->DrawList,pIVar5->Count + L'\x01');
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)&pIVar5->Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar15 = GetColumnOffset(pIVar5->Current);
  fVar16 = GetColumnOffset(pIVar5->Current + L'\x01');
  PushItemWidth((fVar16 - fVar15) * 0.65);
  fVar18 = fVar1 - (window->WindowPadding).x;
  fVar18 = (float)(-(uint)(0.0 <= fVar18) & (uint)fVar18);
  (window->DC).ColumnsOffset.x = fVar18;
  fVar15 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar15 + fVar18);
  (window->WorkRect).Max.x = (fVar16 + fVar15) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}